

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_gDay(void)

{
  char cVar1;
  bool bVar2;
  XSValue_Data *pXVar3;
  XSValue *pXVar4;
  long lVar5;
  int iVar6;
  void *pvVar7;
  char *pcVar8;
  char *pcVar9;
  Status myStatus;
  char iv_3 [5];
  char iv_1 [7];
  char v_3 [6];
  char iv_2 [9];
  char v_2 [12];
  char v_1 [19];
  Status local_114;
  StrX local_110;
  char local_100 [8];
  char local_f8 [8];
  char local_f0 [8];
  char local_e8 [16];
  char local_d8 [16];
  char local_c8 [32];
  ulong local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  builtin_strncpy(local_c8,"   ---31+01:30   \n",0x13);
  builtin_strncpy(local_d8,"---01-01:30",0xc);
  builtin_strncpy(local_f0,"---28",6);
  builtin_strncpy(local_f8,"---+31",7);
  builtin_strncpy(local_e8,"---28.00",9);
  builtin_strncpy(local_100,"--31",5);
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fa,local_c8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fb,local_d8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fc,local_f0,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      if ((ulong)local_114 < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x10ff,local_f8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00128373;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10ff,local_f8,local_110.fLocalForm,0);
LAB_00128373:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      if ((ulong)local_114 < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1100,local_e8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00128479;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1100,local_e8,local_110.fLocalForm,0);
LAB_00128479:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 == st_FOCA0002) goto LAB_00128582;
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    if ((ulong)local_114 < 0xb) {
      pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
    }
    else {
      pcVar8 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x1101,local_100,local_110.fLocalForm,"st_FOCA0002",pcVar8);
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1101,local_100,local_110.fLocalForm,0);
  }
  StrX::~StrX(&local_110);
  errSeen = 1;
LAB_00128582:
  iVar6 = 1;
  do {
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0xc;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111b,local_c8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_50 = 0;
      local_48 = 0x1e;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      bVar2 = compareActualValue(dt_gDay,*pXVar3,
                                 (XSValue_Data)ZEXT2440(CONCAT816(0x1e,CONCAT88(0,local_58))));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0xc;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111c,local_d8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_78 = 0;
      local_70 = 1;
      uStack_6c = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      bVar2 = compareActualValue(dt_gDay,*pXVar3,
                                 (XSValue_Data)ZEXT2440(CONCAT816(1,CONCAT88(0,local_80))));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0xc;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111d,local_f0);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_a0 = 0;
      local_98 = 0x1c;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      bVar2 = compareActualValue(dt_gDay,*pXVar3,
                                 (XSValue_Data)ZEXT2440(CONCAT816(0x1c,CONCAT88(0,local_a8))));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1120,local_f8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pvVar7 = (void *)0x1120;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1120,local_f8);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1121,local_e8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pvVar7 = (void *)0x1121;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1121,local_e8);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1122,local_100,local_110.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pvVar7 = (void *)0x1122;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1122,local_100);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 == 0);
  iVar6 = 1;
  do {
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x113e,local_c8,local_110.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_00128daa;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x113e,local_c8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00128daa:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x113f,local_d8,local_110.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_00128ebf;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x113f,local_d8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00128ebf:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1140,local_f0,local_110.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_00128fc9;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1140,local_f0);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00128fc9:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1144,local_f8,local_110.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_110);
        goto LAB_001290f1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1144,local_f8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_001290f1:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1146,local_e8,local_110.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_110);
        goto LAB_00129222;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1146,local_e8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00129222:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gDay,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1148,local_100,local_110.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_110);
        goto LAB_0012934a;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1148,local_100);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_0012934a:
      errSeen = 1;
    }
    iVar6 = iVar6 + -1;
    if (iVar6 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_gDay()
{
    const XSValue::DataType dt = XSValue::dt_gDay;
    bool  toValidate = true;

    const char v_1[]="   ---31+01:30   \n";
    const char v_2[]="---01-01:30";
    const char v_3[]="---28";

    const char iv_1[]="---+31";
    const char iv_2[]="---28.00";
    const char iv_3[]="--31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 28;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_2);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_3);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}